

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

ElementPtr __thiscall
Rml::Element::ReplaceChild(Element *this,ElementPtr *inserted_element,Element *replaced_element)

{
  Element *this_00;
  code *pcVar1;
  bool bVar2;
  Element *in_RCX;
  int i;
  uint uVar3;
  const_iterator __position;
  Element *pEVar4;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_38;
  
  if (((replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable ==
       (_func_int **)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(inserted_element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x582), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  __position._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       inserted_element[3]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
       _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  while( true ) {
    if ((Element *)__position._M_current ==
        inserted_element[4]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
        _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl) {
      local_38._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
           (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
           (replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable;
      (replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable =
           (_func_int **)0x0;
      AppendChild((Element *)inserted_element,(ElementPtr *)&local_38,true);
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_38);
      (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == in_RCX) break;
    __position._M_current = __position._M_current + 1;
  }
  this_00 = (Element *)(replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable;
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::_M_insert_rval((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                    *)(inserted_element + 3),__position,(value_type *)replaced_element);
  SetParent(this_00,(Element *)inserted_element);
  RemoveChild(this,(Element *)inserted_element);
  uVar3 = 0;
  pEVar4 = this_00;
  while( true ) {
    if (pEVar4 == (Element *)0x0) {
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    if (2 < uVar3) break;
    (*(pEVar4->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])(pEVar4,this_00);
    uVar3 = uVar3 + 1;
    pEVar4 = pEVar4->parent;
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::ReplaceChild(ElementPtr inserted_element, Element* replaced_element)
{
	RMLUI_ASSERT(inserted_element);
	auto insertion_point = children.begin();
	while (insertion_point != children.end() && insertion_point->get() != replaced_element)
	{
		++insertion_point;
	}

	Element* inserted_element_ptr = inserted_element.get();

	if (insertion_point == children.end())
	{
		AppendChild(std::move(inserted_element));
		return nullptr;
	}

	children.insert(insertion_point, std::move(inserted_element));
	inserted_element_ptr->SetParent(this);

	ElementPtr result = RemoveChild(replaced_element);

	Element* ancestor = inserted_element_ptr;
	for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
		ancestor->OnChildAdd(inserted_element_ptr);

	return result;
}